

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.h
# Opt level: O3

hash_type __thiscall libchess::Position::calculate_pawn_hash(Position *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  Piece piece;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  
  uVar2 = 0;
  lVar3 = 0;
  do {
    uVar4 = this->color_bb_[*(int *)((long)&constants::COLORS + lVar3)].value_ &
            this->piece_type_bb_[0].value_;
    if (uVar4 != 0) {
      do {
        lVar1 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        piVar6 = &constants::PIECES;
        lVar5 = 0;
        do {
          if (*piVar6 == *(int *)((long)&constants::COLORS + lVar3) * 8) goto LAB_00107eb0;
          lVar5 = lVar5 + 0x40;
          piVar6 = piVar6 + 1;
        } while (lVar5 != 0x300);
        lVar5 = 0xffffffc0;
LAB_00107eb0:
        uVar2 = uVar2 ^ *(ulong *)(polyglot::random_u64 + (long)(int)((uint)lVar5 | (uint)lVar1) * 8
                                  );
        uVar4 = uVar4 & uVar4 - 1;
      } while (uVar4 != 0);
    }
    lVar3 = lVar3 + 4;
    if (lVar3 == 8) {
      return uVar2;
    }
  } while( true );
}

Assistant:

hash_type calculate_pawn_hash() const {
        hash_type hash_value = 0;
        for (Color c : constants::COLORS) {
            Bitboard bb = piece_type_bb(constants::PAWN, c);
            while (bb) {
                hash_value ^= zobrist::piece_square_key(bb.forward_bitscan(), constants::PAWN, c);
                bb.forward_popbit();
            }
        }
        return hash_value;
    }